

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDEdge::VertexArrayIndex(ON_SubDEdge *this,ON_SubDVertex *v)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (v != (ON_SubDVertex *)0x0) {
    if (this->m_vertex[0] != this->m_vertex[1]) {
      if (this->m_vertex[0] == v) {
        return 0;
      }
      uVar1 = (uint)(this->m_vertex[1] == v) * 2 - 1;
    }
  }
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdge::VertexArrayIndex(const ON_SubDVertex * v) const
{
  if (nullptr == v || m_vertex[0] == m_vertex[1])
    return ON_UNSET_UINT_INDEX;
  if (v == m_vertex[0])
    return 0;
  if (v == m_vertex[1])
    return 1;
  return ON_UNSET_UINT_INDEX;
}